

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::Check<signed_char,4,false,3u>
          (StorageMultisampleTest *this)

{
  char a;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  GLenum GVar5;
  deUint32 dVar6;
  GLenum GVar7;
  GLenum GVar8;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  reference pvVar10;
  signed *psVar11;
  Reference *this_00;
  uint local_50;
  GLuint i;
  allocator<signed_char> local_39;
  undefined1 local_38 [8];
  vector<signed_char,_std::allocator<signed_char>_> result;
  Functions *gl;
  StorageMultisampleTest *this_local;
  
  pRVar9 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar9->_vptr_RenderContext[3])();
  result.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar3);
  GVar4 = TestReferenceDataCount<4,3u>();
  std::allocator<signed_char>::allocator(&local_39);
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)local_38,(ulong)GVar4,&local_39);
  std::allocator<signed_char>::~allocator(&local_39);
  pcVar1 = *(code **)(result.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 0xb8);
  GVar5 = InputTextureTarget<3u>();
  (*pcVar1)(GVar5,this->m_to_aux);
  dVar6 = (**(code **)(result.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x800))();
  glu::checkError(dVar6,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd46);
  pcVar1 = *(code **)(result.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 0xaa0);
  GVar5 = InputTextureTarget<3u>();
  GVar7 = Reference::Format<4,false>();
  GVar8 = Reference::Type<signed_char>();
  pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                      ((vector<signed_char,_std::allocator<signed_char>_> *)local_38,0);
  (*pcVar1)(GVar5,0,GVar7,GVar8,pvVar10);
  dVar6 = (**(code **)(result.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x800))();
  glu::checkError(dVar6,"glGetTexImage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd4a);
  local_50 = 0;
  do {
    GVar4 = TestReferenceDataCount<4,3u>();
    if (GVar4 <= local_50) {
      this_local._7_1_ = true;
LAB_012866bd:
      std::vector<signed_char,_std::allocator<signed_char>_>::~vector
                ((vector<signed_char,_std::allocator<signed_char>_> *)local_38);
      return this_local._7_1_;
    }
    this_00 = (Reference *)local_38;
    pvVar10 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                        ((vector<signed_char,_std::allocator<signed_char>_> *)this_00,
                         (ulong)local_50);
    a = *pvVar10;
    psVar11 = Reference::ReferenceData<signed_char,false>(this_00);
    bVar2 = Reference::Compare<signed_char>(a,psVar11[local_50]);
    if (!bVar2) {
      this_local._7_1_ = false;
      goto LAB_012866bd;
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

bool StorageMultisampleTest::Check()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching data fro auxiliary texture. */
	std::vector<T> result(TestReferenceDataCount<S, D>());

	gl.bindTexture(InputTextureTarget<D>() /* Auxiliary target is the same as input. */, m_to_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.getTexImage(InputTextureTarget<D>() /* Auxiliary target is the same as input. */, 0, Format<S, N>(), Type<T>(),
				   (glw::GLvoid*)(&result[0]));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexImage has failed");

	/* Comparison. */
	for (glw::GLuint i = 0; i < TestReferenceDataCount<S, D>(); ++i)
	{
		if (!Compare<T>(result[i], ReferenceData<T, N>()[i]))
		{
			return false;
		}
	}

	return true;
}